

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.c
# Opt level: O2

void lzma_get_progress(lzma_stream *strm,uint64_t *progress_in,uint64_t *progress_out)

{
  _func_void_void_ptr_uint64_t_ptr_uint64_t_ptr *UNRECOVERED_JUMPTABLE;
  
  UNRECOVERED_JUMPTABLE = (strm->internal->next).get_progress;
  if (UNRECOVERED_JUMPTABLE != (_func_void_void_ptr_uint64_t_ptr_uint64_t_ptr *)0x0) {
    (*UNRECOVERED_JUMPTABLE)((strm->internal->next).coder,progress_in,progress_out);
    return;
  }
  *progress_in = strm->total_in;
  *progress_out = strm->total_out;
  return;
}

Assistant:

extern LZMA_API(void)
lzma_get_progress(lzma_stream *strm,
		uint64_t *progress_in, uint64_t *progress_out)
{
	if (strm->internal->next.get_progress != NULL) {
		strm->internal->next.get_progress(strm->internal->next.coder,
				progress_in, progress_out);
	} else {
		*progress_in = strm->total_in;
		*progress_out = strm->total_out;
	}

	return;
}